

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextoption.cpp
# Opt level: O0

void __thiscall QTextOption::setTabArray(QTextOption *this,QList<double> *tabStops)

{
  long lVar1;
  bool bVar2;
  void *pvVar3;
  const_iterator o;
  QList<QTextOption::Tab> *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  qreal pos;
  QList<double> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QTextOption::Tab> tabs;
  Tab tab;
  parameter_type in_stack_ffffffffffffff78;
  QList<QTextOption::Tab> *in_stack_ffffffffffffff80;
  const_iterator local_38;
  QList<QTextOption::Tab> local_30;
  qsizetype asize;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(in_RDI + 0x10) == 0) {
    pvVar3 = operator_new(0x18);
    QTextOptionPrivate::QTextOptionPrivate((QTextOptionPrivate *)0x89398e);
    *(void **)(in_RDI + 0x10) = pvVar3;
  }
  local_30.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_30.d.ptr = (Tab *)&DAT_aaaaaaaaaaaaaaaa;
  local_30.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QTextOption::Tab>::QList((QList<QTextOption::Tab> *)0x8939ca);
  asize = -1;
  Tab::Tab((Tab *)0x8939ec);
  QList<double>::size((QList<double> *)in_RSI);
  QList<QTextOption::Tab>::reserve(in_RSI,asize);
  local_38.i = (double *)&DAT_aaaaaaaaaaaaaaaa;
  local_38 = QList<double>::begin((QList<double> *)in_stack_ffffffffffffff80);
  o = QList<double>::end((QList<double> *)in_stack_ffffffffffffff80);
  while( true ) {
    bVar2 = QList<double>::const_iterator::operator!=(&local_38,o);
    if (!bVar2) break;
    QList<double>::const_iterator::operator*(&local_38);
    QList<QTextOption::Tab>::append(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    QList<double>::const_iterator::operator++(&local_38);
  }
  QList<QTextOption::Tab>::operator=(&local_30,(QList<QTextOption::Tab> *)in_stack_ffffffffffffff78)
  ;
  QList<QTextOption::Tab>::~QList((QList<QTextOption::Tab> *)0x893ace);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextOption::setTabArray(const QList<qreal> &tabStops)
{
    if (!d)
        d = new QTextOptionPrivate;
    QList<QTextOption::Tab> tabs;
    QTextOption::Tab tab;
    tabs.reserve(tabStops.size());
    for (qreal pos : tabStops) {
        tab.position = pos;
        tabs.append(tab);
    }
    d->tabStops = tabs;
}